

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

void __thiscall QRegionPrivate::intersect(QRegionPrivate *this,QRect *rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Representation RVar8;
  Representation RVar9;
  Representation RVar10;
  pointer pQVar11;
  ulong uVar12;
  pointer pQVar13;
  pointer pQVar14;
  int iVar15;
  QRect *prev;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  
  auVar21 = QRect::normalized();
  (this->extents).x1 = 0;
  (this->extents).y1 = 0;
  (this->extents).x2 = -1;
  (this->extents).y2 = -1;
  (this->innerRect).x1 = 0;
  (this->innerRect).y1 = 0;
  (this->innerRect).x2 = -1;
  (this->innerRect).y2 = -1;
  this->innerArea = -1;
  pQVar11 = QList<QRect>::data(&this->rects);
  iVar16 = this->numRects;
  this->numRects = 0;
  if (iVar16 != 0) {
    pQVar13 = pQVar11;
    do {
      iVar15 = 1 - iVar16;
      pQVar14 = pQVar13;
LAB_00432330:
      pQVar13 = pQVar14 + 1;
      uVar5 = (pQVar14->x1).m_i;
      uVar19 = (ulong)uVar5;
      if ((int)uVar5 <= auVar21._0_4_) {
        uVar19 = auVar21._0_8_ & 0xffffffff;
      }
      uVar5 = (pQVar14->x2).m_i;
      uVar17 = (ulong)uVar5;
      if (auVar21._8_4_ <= (int)uVar5) {
        uVar17 = auVar21._8_8_ & 0xffffffff;
      }
      uVar5 = (pQVar14->y1).m_i;
      uVar20 = (ulong)uVar5;
      if ((int)uVar5 <= auVar21._4_4_) {
        uVar20 = auVar21._0_8_ >> 0x20;
      }
      uVar5 = (pQVar14->y2).m_i;
      uVar12 = (ulong)uVar5;
      if (auVar21._12_4_ <= (int)uVar5) {
        uVar12 = auVar21._8_8_ >> 0x20;
      }
      *(ulong *)pQVar11 = (uVar20 << 0x20) + uVar19;
      *(ulong *)&pQVar11->x2 = (uVar12 << 0x20) + uVar17;
      iVar16 = (int)uVar19;
      if (((int)uVar17 < iVar16) || ((pQVar11->y2).m_i < (pQVar11->y1).m_i)) {
LAB_00432431:
        iVar15 = iVar15 + 1;
        pQVar14 = pQVar13;
        if (iVar15 == 1) {
          return;
        }
        goto LAB_00432330;
      }
      iVar6 = this->numRects;
      if (iVar6 != 0) {
        iVar18 = (this->extents).x1.m_i;
        iVar7 = (this->extents).x2.m_i;
        if (iVar18 < iVar16) {
          iVar16 = iVar18;
        }
        (this->extents).x1.m_i = iVar16;
        iVar16 = (pQVar11->x2).m_i;
        if (iVar16 < iVar7) {
          iVar16 = iVar7;
        }
        (this->extents).x2.m_i = iVar16;
        iVar16 = (this->extents).y2.m_i;
        iVar18 = (pQVar11->y2).m_i;
        if (iVar18 < iVar16) {
          iVar18 = iVar16;
        }
        (this->extents).y2.m_i = iVar18;
        if (((((1 < iVar6) && (pQVar11[-2].y1.m_i == pQVar11[-1].y1.m_i)) ||
             (pQVar11[-1].y2.m_i < (pQVar11->y1).m_i + -1)) ||
            ((pQVar11[-1].x1.m_i != (pQVar11->x1).m_i || (pQVar11[-1].x2.m_i != (pQVar11->x2).m_i)))
            ) || ((iVar15 != 0 &&
                  ((pQVar14[1].y1.m_i == (pQVar11->y1).m_i && ((pQVar13->x1).m_i <= auVar21._8_4_)))
                  ))) goto LAB_0043244a;
        iVar16 = (pQVar11->y2).m_i;
        pQVar11[-1].y2.m_i = iVar16;
        iVar16 = ((iVar16 - pQVar11[-1].y1.m_i) + 1) *
                 ((pQVar11[-1].x2.m_i - pQVar11[-1].x1.m_i) + 1);
        if (this->innerArea < iVar16) {
          this->innerArea = iVar16;
          iVar16 = pQVar11[-1].y1.m_i;
          iVar6 = pQVar11[-1].x2.m_i;
          iVar18 = pQVar11[-1].y2.m_i;
          (this->innerRect).x1.m_i = pQVar11[-1].x1.m_i;
          (this->innerRect).y1.m_i = iVar16;
          (this->innerRect).x2.m_i = iVar6;
          (this->innerRect).y2.m_i = iVar18;
        }
        goto LAB_00432431;
      }
      RVar8.m_i = (pQVar11->y1).m_i;
      RVar9.m_i = (pQVar11->x2).m_i;
      RVar10.m_i = (pQVar11->y2).m_i;
      (this->extents).x1 = (Representation)(pQVar11->x1).m_i;
      (this->extents).y1 = (Representation)RVar8.m_i;
      (this->extents).x2 = (Representation)RVar9.m_i;
      (this->extents).y2 = (Representation)RVar10.m_i;
LAB_0043244a:
      uVar1 = pQVar11->x2;
      uVar3 = pQVar11->y2;
      uVar2 = pQVar11->x1;
      uVar4 = pQVar11->y1;
      iVar16 = ((uVar3 - uVar4) + 1) * ((uVar1 - uVar2) + 1);
      if (this->innerArea < iVar16) {
        this->innerArea = iVar16;
        iVar16 = (pQVar11->y1).m_i;
        iVar18 = (pQVar11->x2).m_i;
        iVar7 = (pQVar11->y2).m_i;
        (this->innerRect).x1.m_i = (pQVar11->x1).m_i;
        (this->innerRect).y1.m_i = iVar16;
        (this->innerRect).x2.m_i = iVar18;
        (this->innerRect).y2.m_i = iVar7;
      }
      iVar16 = -iVar15;
      pQVar11 = pQVar11 + 1;
      this->numRects = iVar6 + 1;
    } while (iVar15 != 0);
  }
  return;
}

Assistant:

void QRegionPrivate::intersect(const QRect &rect)
{
    Q_ASSERT(extents.intersects(rect));
    Q_ASSERT(numRects > 1);

#ifdef QT_REGION_DEBUG
    selfTest();
#endif

    const QRect r = rect.normalized();
    extents = QRect();
    innerRect = QRect();
    innerArea = -1;

    QRect *dest = rects.data();
    const QRect *src = dest;
    int n = numRects;
    numRects = 0;
    while (n--) {
        *dest = qt_rect_intersect_normalized(*src++, r);
        if (dest->isEmpty())
            continue;

        if (numRects == 0) {
            extents = *dest;
        } else {
            extents.setLeft(qMin(extents.left(), dest->left()));
            // hw: extents.top() will never change after initialization
            //extents.setTop(qMin(extents.top(), dest->top()));
            extents.setRight(qMax(extents.right(), dest->right()));
            extents.setBottom(qMax(extents.bottom(), dest->bottom()));

            const QRect *nextToLast = (numRects > 1 ? dest - 2 : nullptr);

            // mergeFromBelow inlined and optimized
            if (canMergeFromBelow(dest - 1, dest, nextToLast, nullptr)) {
                if (!n || src->y() != dest->y() || src->left() > r.right()) {
                    QRect *prev = dest - 1;
                    prev->setBottom(dest->bottom());
                    updateInnerRect(*prev);
                    continue;
                }
            }
        }
        updateInnerRect(*dest);
        ++dest;
        ++numRects;
    }
#ifdef QT_REGION_DEBUG
    selfTest();
#endif
}